

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Output::matchEnumScalar(Output *this,char *Str,bool Match)

{
  StringRef local_30;
  undefined1 local_19;
  char *pcStack_18;
  bool Match_local;
  char *Str_local;
  Output *this_local;
  
  if ((Match) && ((this->EnumerationMatchFound & 1U) == 0)) {
    local_19 = Match;
    pcStack_18 = Str;
    Str_local = (char *)this;
    newLineCheck(this);
    StringRef::StringRef(&local_30,pcStack_18);
    outputUpToEndOfLine(this,local_30);
    this->EnumerationMatchFound = true;
  }
  return false;
}

Assistant:

bool Output::matchEnumScalar(const char *Str, bool Match) {
  if (Match && !EnumerationMatchFound) {
    newLineCheck();
    outputUpToEndOfLine(Str);
    EnumerationMatchFound = true;
  }
  return false;
}